

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

EntryType * __thiscall
JsUtil::
BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::
IteratorBase<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
::Current(IteratorBase<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
          *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  EntryType *pEVar5;
  
  bVar2 = EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x4d9,"(IsValid_Virtual())","IsValid_Virtual()");
    if (!bVar2) goto LAB_0047d45b;
    *puVar3 = 0;
  }
  pEVar5 = this->entries;
  lVar4 = (long)this->entryIndex;
  if (pEVar5[lVar4].
      super_DefaultHashedEntry<unsigned_int,_InductionVariable,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .super_ImplicitKeyValueEntry<unsigned_int,_InductionVariable>.
      super_ValueEntry<InductionVariable,_JsUtil::(anonymous_namespace)::ValueEntryData<InductionVariable>_>
      .super_ValueEntryData<InductionVariable>.next < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x4da,"(!IsFreeEntry(entries[entryIndex]))",
                       "!IsFreeEntry(entries[entryIndex])");
    if (!bVar2) {
LAB_0047d45b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pEVar5 = this->entries;
    lVar4 = (long)this->entryIndex;
  }
  return pEVar5 + lVar4;
}

Assistant:

EntryType &Current() const
            {
                Assert(IsValid_Virtual());
                Assert(!IsFreeEntry(entries[entryIndex]));

                return entries[entryIndex];
            }